

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O3

char * flatbuffers::EnumName<unsigned_char>(uchar tval,TypeTable *type_table)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (type_table == (TypeTable *)0x0) {
    return (char *)0x0;
  }
  if (type_table->names == (char **)0x0) {
    return (char *)0x0;
  }
  sVar3 = (size_t)tval;
  sVar1 = type_table->num_elems;
  if (type_table->values != (int64_t *)0x0) {
    if (sVar1 == 0) {
      return (char *)0x0;
    }
    sVar2 = 0;
    while (type_table->values[sVar2] != sVar3) {
      sVar2 = sVar2 + 1;
      if (sVar1 == sVar2) {
        return (char *)0x0;
      }
    }
    sVar3 = sVar2;
    if ((long)sVar2 < 0) {
      return (char *)0x0;
    }
  }
  if ((long)sVar1 <= (long)sVar3) {
    return (char *)0x0;
  }
  return type_table->names[sVar3];
}

Assistant:

const char *EnumName(T tval, const TypeTable *type_table) {
  if (!type_table || !type_table->names) return nullptr;
  auto i = LookupEnum(static_cast<int64_t>(tval), type_table->values,
                      type_table->num_elems);
  if (i >= 0 && i < static_cast<int64_t>(type_table->num_elems)) {
    return type_table->names[i];
  }
  return nullptr;
}